

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split_uri.c
# Opt level: O0

void init_curi_settings(curi_settings *s)

{
  curi_settings *s_local;
  
  curi_default_settings(s);
  s->scheme_callback = scheme;
  s->userinfo_callback = userinfo;
  s->host_callback = host;
  s->portStr_callback = portStr;
  s->path_callback = path;
  s->path_segment_callback = path_segment;
  s->query_callback = query;
  s->query_item_null_callback = query_item_null;
  s->query_item_double_callback = query_item_double;
  s->query_item_int_callback = query_item_int;
  s->query_item_str_callback = query_item_str;
  s->fragment_callback = fragment;
  return;
}

Assistant:

static void init_curi_settings(curi_settings* s)
{
    curi_default_settings(s);
    s->scheme_callback            = scheme;
    s->userinfo_callback          = userinfo;
    s->host_callback              = host;
    s->portStr_callback           = portStr;
    s->path_callback              = path;
    s->path_segment_callback      = path_segment;
    s->query_callback             = query;
    s->query_item_null_callback   = query_item_null;
    s->query_item_double_callback = query_item_double;
    s->query_item_int_callback    = query_item_int;
    s->query_item_str_callback    = query_item_str;
    s->fragment_callback          = fragment;
}